

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O1

bool __thiscall
google::protobuf::compiler::Parser::ParseFieldOptions
          (Parser *this,FieldDescriptorProto *field,LocationRecorder *field_location,
          FileDescriptorProto *containing_file)

{
  pointer __s1;
  size_type sVar1;
  bool bVar2;
  int iVar3;
  FieldOptions *pFVar4;
  FileDescriptorProto *containing_file_00;
  Arena *arena;
  size_type __rlen;
  string_view text;
  string_view text_00;
  string_view text_01;
  LocationRecorder location;
  LocationRecorder LStack_48;
  
  bVar2 = true;
  if (((this->input_->current_).text._M_string_length == 1) &&
     (containing_file_00 = containing_file,
     iVar3 = bcmp((this->input_->current_).text._M_dataplus._M_p,"[",1), iVar3 == 0)) {
    LocationRecorder::Init(&LStack_48,field_location,field_location->source_code_info_);
    RepeatedField<int>::Add(&((LStack_48.location_)->field_0)._impl_.path_,8);
    text._M_str = "[";
    text._M_len = 1;
    bVar2 = Consume(this,text);
    if (bVar2) {
      do {
        __s1 = (this->input_->current_).text._M_dataplus._M_p;
        sVar1 = (this->input_->current_).text._M_string_length;
        if (sVar1 == 9) {
          iVar3 = bcmp(__s1,"json_name",9);
          if (iVar3 != 0) goto LAB_001fe36b;
          bVar2 = ParseJsonName(this,field,field_location,containing_file_00);
        }
        else if ((sVar1 == 7) && (iVar3 = bcmp(__s1,"default",7), iVar3 == 0)) {
          bVar2 = ParseDefaultAssignment(this,field,field_location,containing_file_00);
        }
        else {
LAB_001fe36b:
          *(byte *)&field->field_0 = *(byte *)&field->field_0 | 0x20;
          if ((field->field_0)._impl_.options_ == (FieldOptions *)0x0) {
            arena = (Arena *)(field->super_Message).super_MessageLite._internal_metadata_.ptr_;
            if (((ulong)arena & 1) != 0) {
              arena = *(Arena **)((ulong)arena & 0xfffffffffffffffe);
            }
            pFVar4 = (FieldOptions *)Arena::DefaultConstruct<google::protobuf::FieldOptions>(arena);
            (field->field_0)._impl_.options_ = pFVar4;
          }
          containing_file_00 = containing_file;
          bVar2 = ParseOption(this,&((field->field_0)._impl_.options_)->super_Message,&LStack_48,
                              containing_file,OPTION_ASSIGNMENT);
        }
        if (bVar2 == false) goto LAB_001fe3ef;
        text_00._M_str = ",";
        text_00._M_len = 1;
        bVar2 = TryConsume(this,text_00);
      } while (bVar2);
      text_01._M_str = "]";
      text_01._M_len = 1;
      bVar2 = Consume(this,text_01);
    }
    else {
LAB_001fe3ef:
      bVar2 = false;
    }
    LocationRecorder::~LocationRecorder(&LStack_48);
  }
  return bVar2;
}

Assistant:

bool Parser::ParseFieldOptions(FieldDescriptorProto* field,
                               const LocationRecorder& field_location,
                               const FileDescriptorProto* containing_file) {
  if (!LookingAt("[")) return true;

  LocationRecorder location(field_location,
                            FieldDescriptorProto::kOptionsFieldNumber);

  DO(Consume("["));

  // Parse field options.
  do {
    if (LookingAt("default")) {
      // We intentionally pass field_location rather than location here, since
      // the default value is not actually an option.
      DO(ParseDefaultAssignment(field, field_location, containing_file));
    } else if (LookingAt("json_name")) {
      // Like default value, this "json_name" is not an actual option.
      DO(ParseJsonName(field, field_location, containing_file));
    } else {
      DO(ParseOption(field->mutable_options(), location, containing_file,
                     OPTION_ASSIGNMENT));
    }
  } while (TryConsume(","));

  DO(Consume("]"));
  return true;
}